

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp.h
# Opt level: O1

double __thiscall iir_filter<6>::operator()(iir_filter<6> *this,double in)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  array<double,_7UL> *paVar4;
  double dVar5;
  double yvn;
  double local_18;
  double local_10;
  
  local_10 = in;
  boost::circular_buffer<double,std::allocator<double>>::push_front_impl<double_const&>
            (&this->xv_m,&local_10);
  pdVar3 = (this->xv_m).m_first;
  local_18 = 0.0;
  dVar5 = 0.0;
  if (pdVar3 != (double *)0x0 && (this->xv_m).m_size != 0) {
    paVar4 = &this->b_m;
    do {
      dVar5 = dVar5 + *pdVar3 * paVar4->_M_elems[0];
      pdVar1 = pdVar3 + 1;
      if (pdVar3 + 1 == (this->xv_m).m_end) {
        pdVar1 = (this->xv_m).m_buff;
      }
      pdVar3 = pdVar1;
      if (pdVar1 == (this->xv_m).m_last) {
        pdVar3 = (double *)0x0;
      }
      paVar4 = (array<double,_7UL> *)(paVar4->_M_elems + 1);
    } while (pdVar3 != (double *)0x0);
  }
  pdVar3 = (this->yv_m).m_first;
  if (pdVar3 != (double *)0x0 && (this->yv_m).m_size != 0) {
    pdVar1 = (this->a_m)._M_elems;
    local_18 = 0.0;
    do {
      pdVar1 = pdVar1 + 1;
      local_18 = local_18 + *pdVar3 * *pdVar1;
      pdVar2 = pdVar3 + 1;
      if (pdVar3 + 1 == (this->yv_m).m_end) {
        pdVar2 = (this->yv_m).m_buff;
      }
      pdVar3 = pdVar2;
      if (pdVar2 == (this->yv_m).m_last) {
        pdVar3 = (double *)0x0;
      }
    } while (pdVar3 != (double *)0x0);
  }
  local_18 = this->gain_m * dVar5 - local_18;
  boost::circular_buffer<double,std::allocator<double>>::push_front_impl<double_const&>
            (&this->yv_m,&local_18);
  return local_18;
}

Assistant:

double operator()(double in)
    {
        xv_m.push_front(in);
        double yvn =
            gain_m * std::inner_product(xv_m.begin(), xv_m.end(), b_m.begin(), 0.0) -
            std::inner_product(yv_m.begin(), yv_m.end(), a_m.begin() + 1, 0.0);
        yv_m.push_front(yvn);
        return yvn;
    }